

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O2

void __thiscall
OpenMD::Electrostatic::calcSurfaceTerm(Electrostatic *this,bool slabGeometry,int axis,RealType *pot)

{
  long lVar1;
  int iVar2;
  Molecule *pMVar3;
  long lVar4;
  Atom *pAVar5;
  pointer ppAVar6;
  RealType RVar7;
  double dVar8;
  double dVar9;
  Molecule *local_170;
  MoleculeIterator mi;
  Vector3d netDipole;
  Vector<double,_3U> local_138;
  Vector<double,_3U> local_120;
  Vector3d D;
  Vector3d r;
  ElectrostaticAtomData data;
  Vector3d t;
  
  mi._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&r.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&D.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&t.super_Vector<double,_3U>);
  local_120.data_[0] = 0.0;
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&data,local_120.data_);
  Vector<double,_3U>::Vector(&netDipole.super_Vector<double,_3U>,(Vector<double,_3U> *)&data);
  ElectrostaticAtomData::ElectrostaticAtomData(&data);
  if (this->initialized_ == false) {
    initialize(this);
  }
  pMVar3 = SimInfo::beginMolecule(this->info_,&mi);
  while (pMVar3 != (Molecule *)0x0) {
    ppAVar6 = (pMVar3->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar6 !=
        (pMVar3->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_00236a79;
    pAVar5 = (Atom *)0x0;
    while (pAVar5 != (Atom *)0x0) {
      iVar2 = AtomType::getIdent(pAVar5->atomType_);
      ElectrostaticAtomData::operator=
                (&data,(this->ElectrostaticMap).
                       super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar2]);
      if (data.is_Charge == true) {
        RVar7 = data.fixedCharge;
        if (data.is_Fluctuating == true) {
          RVar7 = data.fixedCharge +
                  *(double *)
                   (*(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                     atomData).flucQPos.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (pAVar5->super_StuntDouble).storage_) +
                   (long)(pAVar5->super_StuntDouble).localIndex_ * 8);
        }
        StuntDouble::getPos((Vector3d *)&local_120,&pAVar5->super_StuntDouble);
        Vector<double,_3U>::operator=(&r.super_Vector<double,_3U>,&local_120);
        Snapshot::wrapVector
                  (this->info_->sman_->currentSnapshot_,(Vector3d *)&r.super_Vector<double,_3U>);
        operator*(&local_120,RVar7,&r.super_Vector<double,_3U>);
        Vector<double,_3U>::add(&netDipole.super_Vector<double,_3U>,&local_120);
      }
      if (data.is_Dipole == true) {
        StuntDouble::getDipole((Vector3d *)&local_138,&pAVar5->super_StuntDouble);
        operator*(&local_120,&local_138,0.20819434);
        Vector3<double>::operator=((Vector3<double> *)&D.super_Vector<double,_3U>,&local_120);
        Vector<double,_3U>::add(&netDipole.super_Vector<double,_3U>,&D.super_Vector<double,_3U>);
      }
      ppAVar6 = ppAVar6 + 1;
      pAVar5 = (Atom *)0x0;
      if (ppAVar6 !=
          (pMVar3->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_00236a79:
        pAVar5 = *ppAVar6;
      }
    }
    pMVar3 = SimInfo::nextMolecule(this->info_,&mi);
  }
  dVar8 = Snapshot::getVolume(this->info_->sman_->currentSnapshot_);
  if (slabGeometry) {
    netDipole.super_Vector<double,_3U>.data_[(long)(axis + 1) % 3 & 0xffffffff] = 0.0;
    netDipole.super_Vector<double,_3U>.data_[(long)(axis + 2) % 3 & 0xffffffff] = 0.0;
  }
  else {
    dVar8 = dVar8 * 3.0;
  }
  dVar9 = Vector<double,_3U>::lengthSquare(&netDipole.super_Vector<double,_3U>);
  *pot = dVar9 * (6.283185307179586 / dVar8) * 332.0637778 + *pot;
  local_170 = SimInfo::beginMolecule(this->info_,&mi);
  dVar8 = (6.283185307179586 / dVar8) * -332.0637778;
  dVar8 = dVar8 + dVar8;
  while (local_170 != (Molecule *)0x0) {
    ppAVar6 = (local_170->atoms_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppAVar6 !=
        (local_170->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) goto LAB_00236d32;
    pAVar5 = (Atom *)0x0;
    while (pAVar5 != (Atom *)0x0) {
      operator*(&local_138,dVar8,&netDipole.super_Vector<double,_3U>);
      Vector<double,_3U>::Vector(&local_120,&local_138);
      StuntDouble::addElectricField(&pAVar5->super_StuntDouble,(Vector3d *)&local_120);
      iVar2 = AtomType::getIdent(pAVar5->atomType_);
      ElectrostaticAtomData::operator=
                (&data,(this->ElectrostaticMap).
                       super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar2]);
      RVar7 = data.fixedCharge;
      if (data.is_Charge == true) {
        if (data.is_Fluctuating == true) {
          StuntDouble::getPos((Vector3d *)&local_120,&pAVar5->super_StuntDouble);
          Vector<double,_3U>::operator=(&r.super_Vector<double,_3U>,&local_120);
          Snapshot::wrapVector
                    (this->info_->sman_->currentSnapshot_,(Vector3d *)&r.super_Vector<double,_3U>);
          dVar9 = dot<double,3u>(&r.super_Vector<double,_3U>,&netDipole.super_Vector<double,_3U>);
          lVar4 = (long)(pAVar5->super_StuntDouble).localIndex_;
          lVar1 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).flucQFrc.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start +
                           (pAVar5->super_StuntDouble).storage_);
          *(double *)(lVar1 + lVar4 * 8) = dVar9 * dVar8 + *(double *)(lVar1 + lVar4 * 8);
        }
        operator*(&local_138,RVar7 * dVar8,&netDipole.super_Vector<double,_3U>);
        Vector<double,_3U>::Vector(&local_120,&local_138);
        StuntDouble::addFrc(&pAVar5->super_StuntDouble,(Vector3d *)&local_120);
      }
      if (data.is_Dipole == true) {
        StuntDouble::getDipole((Vector3d *)&local_138,&pAVar5->super_StuntDouble);
        operator*(&local_120,&local_138,0.20819434);
        Vector3<double>::operator=(&D,&local_120);
        cross<double>((Vector3<double> *)&local_138,&D,&netDipole);
        operator*(&local_120,dVar8,&local_138);
        Vector3<double>::operator=(&t,&local_120);
        StuntDouble::addTrq(&pAVar5->super_StuntDouble,&t);
      }
      ppAVar6 = ppAVar6 + 1;
      pAVar5 = (Atom *)0x0;
      if (ppAVar6 !=
          (local_170->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_00236d32:
        pAVar5 = *ppAVar6;
      }
    }
    local_170 = SimInfo::nextMolecule(this->info_,&mi);
  }
  return;
}

Assistant:

void Electrostatic::calcSurfaceTerm(bool slabGeometry, int axis,
                                      RealType& pot) {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    RealType C;
    Vector3d r;
    Vector3d D;
    Vector3d t;
    Vector3d netDipole(0.0);
    int atid;
    ElectrostaticAtomData data;

    const RealType mPoleConverter = 0.20819434;  // converts from the
                                                 // internal units of
                                                 // Debye (for dipoles)
                                                 // or Debye-angstroms
                                                 // (for quadrupoles) to
                                                 // electron angstroms or
                                                 // electron-angstroms^2

    const RealType eConverter = 332.0637778;  // convert the
                                              // Charge-Charge
                                              // electrostatic
                                              // interactions into kcal /
                                              // mol assuming distances
                                              // are measured in
                                              // angstroms.

    if (!initialized_) initialize();

    for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
         mol           = info_->nextMolecule(mi)) {
      for (Atom* atom = mol->beginAtom(ai); atom != NULL;
           atom       = mol->nextAtom(ai)) {
        atid = atom->getAtomType()->getIdent();
        data = ElectrostaticMap[Etids[atid]];

        if (data.is_Charge) {
          C = data.fixedCharge;
          if (data.is_Fluctuating) C += atom->getFlucQPos();

          r = atom->getPos();
          info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

          netDipole += C * r;
        }

        if (data.is_Dipole) {
          D = atom->getDipole() * mPoleConverter;
          netDipole += D;
        }
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, netDipole.getArrayPointer(), 3, MPI_REALTYPE,
                  MPI_SUM, MPI_COMM_WORLD);
#endif

    RealType V = info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();
    RealType prefactor;

    if (slabGeometry) {
      prefactor = 2.0 * Constants::PI / V;
      // Compute complementary axes to the privileged axis
      int axis1        = (axis + 1) % 3;
      int axis2        = (axis + 2) % 3;
      netDipole[axis1] = 0.0;
      netDipole[axis2] = 0.0;
    } else {
      prefactor = 2.0 * Constants::PI / (3.0 * V);
    }

    pot += eConverter * prefactor * netDipole.lengthSquare();

    for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
         mol           = info_->nextMolecule(mi)) {
      for (Atom* atom = mol->beginAtom(ai); atom != NULL;
           atom       = mol->nextAtom(ai)) {
        atom->addElectricField(-eConverter * prefactor * 2.0 * netDipole);

        atid = atom->getAtomType()->getIdent();
        data = ElectrostaticMap[Etids[atid]];

        if (data.is_Charge) {
          C = data.fixedCharge;
          if (data.is_Fluctuating) {
            r = atom->getPos();
            info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);
            atom->addFlucQFrc(-eConverter * prefactor * 2.0 *
                              dot(r, netDipole));
          }
          atom->addFrc(-eConverter * prefactor * 2.0 * C * netDipole);
        }

        if (data.is_Dipole) {
          D = atom->getDipole() * mPoleConverter;
          t = -eConverter * prefactor * 2.0 * cross(D, netDipole);
          atom->addTrq(t);
        }
      }
    }
  }